

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.cpp
# Opt level: O0

void __thiscall
qclab::qgates::CZ<std::complex<double>_>::apply
          (CZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int target_00;
  int iVar2;
  int iVar3;
  int controlState;
  reference pvVar4;
  complex<double> *vector_00;
  anon_class_8_1_703dd281_conflict2 local_60;
  anon_class_8_1_703dd281_conflict2 f;
  int target;
  undefined1 local_40 [4];
  int control;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  CZ<std::complex<double>_> *this_local;
  
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = offset;
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])();
  iVar3 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  iVar1 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  *pvVar4 = *pvVar4 + iVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  *pvVar4 = *pvVar4 + iVar1;
  iVar2 = QControlledGate2<std::complex<double>_>::control
                    (&this->super_QControlledGate2<std::complex<double>_>);
  iVar2 = iVar2 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])();
  f.vector._0_4_ =
       iVar3 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_;
  vector_00 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data
                        (vector);
  local_60 = lambda_PauliZ<std::complex<double>>(op,vector_00);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  iVar3 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  target_00 = (int)f.vector;
  iVar1 = *pvVar4;
  controlState = QControlledGate2<std::complex<double>_>::controlState
                           (&this->super_QControlledGate2<std::complex<double>_>);
  apply4b<qclab::qgates::lambda_PauliZ<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar3,iVar1,iVar2,target_00,controlState,&local_60);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void CZ< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliZ( op , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }